

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O0

int Delete(BiTree *p)

{
  BiTree pBVar1;
  BiTNode *local_28;
  BiTree s;
  BiTree q;
  BiTree *p_local;
  
  if ((*p)->rchlid == (BiTNode *)0x0) {
    pBVar1 = *p;
    *p = (*p)->lchild;
    free(pBVar1);
  }
  else if ((*p)->lchild == (BiTNode *)0x0) {
    pBVar1 = *p;
    *p = (*p)->rchlid;
    free(pBVar1);
  }
  else {
    s = *p;
    for (local_28 = (*p)->lchild; local_28->rchlid != (BiTNode *)0x0; local_28 = local_28->rchlid) {
      s = local_28;
    }
    (*p)->data = local_28->data;
    s->lchild = local_28->lchild;
    free(local_28);
  }
  return p_local._4_4_;
}

Assistant:

int Delete(BiTree *p){
    BiTree q,s;

    if((*p)->rchlid == NULL){     //右子树为空，重接他的左子树
        q = *p;
        *p = (*p)->lchild;
        free(q);
    } else if((*p)->lchild == NULL){  //左子树为空，重接他的右子树
        q = *p;
        *p = (*p)->rchlid;
        free(q);
    }else{                            //左右子树都部位空
        q = *p;
        s = (*p)->lchild;
        while(s->rchlid){             //找到左子树的最右子树
            q = s;
            s = s->rchlid;
        }

        (*p)->data = s->data;         //s指向被删除结点的直接前驱（将被删除结点的值改为直接前驱结点的值）

        q->lchild = s->lchild;    //重接q的左子树

        free(s);
    }
}